

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

OneofOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::OneofOptions>
          (Tables *this,OneofOptions *param_2)

{
  OneofOptions *pOVar1;
  OneofOptions *in_RSI;
  OneofOptions *result;
  OneofOptions **in_stack_ffffffffffffffd8;
  vector<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  pOVar1 = (OneofOptions *)operator_new(0x48);
  OneofOptions::OneofOptions(in_RSI);
  std::
  vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
  ::emplace_back<google::protobuf::OneofOptions*&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return pOVar1;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.emplace_back(result);
  return result;
}